

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

bool __thiscall
TPZMatrix<int>::SolveEigensystemJacobi
          (TPZMatrix<int> *this,int64_t *numiterations,REAL *tol,TPZVec<int> *Eigenvalues,
          TPZFMatrix<int> *Eigenvectors)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong row;
  bool bVar5;
  int iVar6;
  int *piVar7;
  int64_t j;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int64_t i_1;
  double dVar11;
  double local_3c8;
  long local_388;
  TPZFNMatrix<9,_int> Matrix_1;
  TPZFNMatrix<3,_int> VecIni_cp;
  TPZFNMatrix<3,_int> VecIni;
  TPZFMatrix<int> local_178;
  TPZFNMatrix<9,_int> Matrix;
  
  lVar4 = *numiterations;
  dVar1 = *tol;
  row = (this->super_TPZBaseMatrix).fRow;
  TPZFNMatrix<9,_int>::TPZFNMatrix(&Matrix,row,row);
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (long)row) {
    uVar10 = row;
  }
  for (; uVar9 != uVar10; uVar9 = uVar9 + 1) {
    for (uVar8 = 0; row != uVar8; uVar8 = uVar8 + 1) {
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                        (this,uVar9,uVar8);
      piVar7 = TPZFMatrix<int>::operator()(&Matrix.super_TPZFMatrix<int>,uVar9,uVar8);
      *piVar7 = iVar6;
    }
  }
  bVar5 = SolveEigenvaluesJacobi((TPZMatrix<int> *)&Matrix,numiterations,tol,Eigenvalues);
  if (bVar5) {
    Matrix_1.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable._0_4_ = 0;
    TPZFNMatrix<3,_int>::TPZFNMatrix(&VecIni,row,1,(int *)&Matrix_1);
    Matrix_1.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable._0_4_ = 0;
    TPZFNMatrix<3,_int>::TPZFNMatrix(&VecIni_cp,row,1,(int *)&Matrix_1);
    (*(Eigenvectors->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(Eigenvectors,row,row);
    (*(Eigenvectors->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])(Eigenvectors);
    for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
      for (uVar8 = 0; row != uVar8; uVar8 = uVar8 + 1) {
        iVar6 = rand();
        VecIni.super_TPZFMatrix<int>.fElem[uVar8] = iVar6;
      }
      TPZFMatrix<int>::TPZFMatrix(&local_178,this);
      TPZFNMatrix<9,_int>::TPZFNMatrix(&Matrix_1,&local_178);
      TPZFMatrix<int>::~TPZFMatrix(&local_178);
      iVar6 = ReturnNearestValue(Eigenvalues->fStore[uVar9],Eigenvalues,0);
      dVar11 = ABS((double)(iVar6 - Eigenvalues->fStore[uVar9]));
      if (dVar11 <= 1e-05) {
        for (uVar8 = 0; row != uVar8; uVar8 = uVar8 + 1) {
          iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,uVar8,uVar8);
          Matrix_1.super_TPZFMatrix<int>.fElem
          [(uVar8 & 0xffffffff) *
           Matrix_1.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow + uVar8] =
               iVar6 - Eigenvalues->fStore[uVar9];
        }
      }
      else {
        for (uVar8 = 0; row != uVar8; uVar8 = uVar8 + 1) {
          iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,uVar8,uVar8);
          Matrix_1.super_TPZFMatrix<int>.fElem
          [(uVar8 & 0xffffffff) *
           Matrix_1.super_TPZFMatrix<int>.super_TPZMatrix<int>.super_TPZBaseMatrix.fRow + uVar8] =
               (iVar6 + (int)(dVar11 * 0.01)) - Eigenvalues->fStore[uVar9];
        }
      }
      local_3c8 = 0.0;
      for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        piVar7 = TPZFMatrix<int>::operator()(&VecIni.super_TPZFMatrix<int>,uVar8,0);
        iVar6 = *piVar7;
        piVar7 = TPZFMatrix<int>::operator()(&VecIni.super_TPZFMatrix<int>,uVar8,0);
        local_3c8 = local_3c8 + ABS((double)*piVar7) * ABS((double)iVar6);
      }
      if (local_3c8 < 0.0) {
        local_3c8 = sqrt(local_3c8);
      }
      else {
        local_3c8 = SQRT(local_3c8);
      }
      for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        piVar7 = TPZFMatrix<int>::operator()(&VecIni.super_TPZFMatrix<int>,uVar8,0);
        iVar6 = *piVar7;
        piVar7 = TPZFMatrix<int>::operator()(&VecIni.super_TPZFMatrix<int>,uVar8,0);
        *piVar7 = iVar6 / (int)local_3c8;
      }
      local_3c8 = 10.0;
      for (local_388 = 0; (dVar1 < local_3c8 && (local_388 <= lVar4)); local_388 = local_388 + 1) {
        for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
          piVar7 = TPZFMatrix<int>::operator()(&VecIni.super_TPZFMatrix<int>,uVar8,0);
          iVar6 = *piVar7;
          piVar7 = TPZFMatrix<int>::operator()(&VecIni_cp.super_TPZFMatrix<int>,uVar8,0);
          *piVar7 = iVar6;
        }
        Solve_LU((TPZMatrix<int> *)&Matrix_1,&VecIni.super_TPZFMatrix<int>);
        local_3c8 = 0.0;
        for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
          piVar7 = TPZFMatrix<int>::operator()(&VecIni.super_TPZFMatrix<int>,uVar8,0);
          iVar6 = *piVar7;
          piVar7 = TPZFMatrix<int>::operator()(&VecIni.super_TPZFMatrix<int>,uVar8,0);
          local_3c8 = local_3c8 + ABS((double)*piVar7) * ABS((double)iVar6);
        }
        if (local_3c8 < 0.0) {
          dVar11 = sqrt(local_3c8);
        }
        else {
          dVar11 = SQRT(local_3c8);
        }
        local_3c8 = 0.0;
        for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
          piVar7 = TPZFMatrix<int>::operator()(&VecIni.super_TPZFMatrix<int>,uVar8,0);
          iVar6 = *piVar7;
          piVar7 = TPZFMatrix<int>::operator()(&VecIni.super_TPZFMatrix<int>,uVar8,0);
          *piVar7 = iVar6 / (int)dVar11;
          piVar7 = TPZFMatrix<int>::operator()(&VecIni_cp.super_TPZFMatrix<int>,uVar8,0);
          iVar6 = *piVar7;
          piVar7 = TPZFMatrix<int>::operator()(&VecIni.super_TPZFMatrix<int>,uVar8,0);
          iVar2 = *piVar7;
          piVar7 = TPZFMatrix<int>::operator()(&VecIni_cp.super_TPZFMatrix<int>,uVar8,0);
          iVar3 = *piVar7;
          piVar7 = TPZFMatrix<int>::operator()(&VecIni.super_TPZFMatrix<int>,uVar8,0);
          local_3c8 = local_3c8 + ABS((double)((iVar3 - *piVar7) * (iVar6 - iVar2)));
        }
        if (local_3c8 < 0.0) {
          local_3c8 = sqrt(local_3c8);
        }
        else {
          local_3c8 = SQRT(local_3c8);
        }
      }
      for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        piVar7 = TPZFMatrix<int>::operator()(&VecIni.super_TPZFMatrix<int>,uVar8,0);
        iVar6 = *piVar7;
        piVar7 = TPZFMatrix<int>::operator()(Eigenvectors,uVar9,uVar8);
        if (ABS((double)iVar6) < 1e-05) {
          iVar6 = 0;
        }
        *piVar7 = iVar6;
      }
      TPZFNMatrix<9,_int>::~TPZFNMatrix(&Matrix_1);
    }
    TPZFNMatrix<3,_int>::~TPZFNMatrix(&VecIni_cp);
    TPZFNMatrix<3,_int>::~TPZFNMatrix(&VecIni);
  }
  TPZFNMatrix<9,_int>::~TPZFNMatrix(&Matrix);
  return bVar5;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}